

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

int lyplg_type_sort_int(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  switch(val1->realtype->basetype) {
  case LY_TYPE_INT8:
    if ((val1->field_2).boolean < (val2->field_2).boolean) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).boolean < (val1->field_2).boolean) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_INT16:
    if ((val1->field_2).int16 < (val2->field_2).int16) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).int16 < (val1->field_2).int16) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_INT32:
    if ((val1->field_2).int32 < (val2->field_2).int32) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).int32 < (val1->field_2).int32) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  case LY_TYPE_INT64:
    if ((val1->field_2).dec64 < (val2->field_2).dec64) {
      UNUSED_ctx_local._4_4_ = -1;
    }
    else if ((val2->field_2).dec64 < (val1->field_2).dec64) {
      UNUSED_ctx_local._4_4_ = 1;
    }
    else {
      UNUSED_ctx_local._4_4_ = 0;
    }
    break;
  default:
    UNUSED_ctx_local._4_4_ = 0;
  }
  return UNUSED_ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF int
lyplg_type_sort_int(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    switch (val1->realtype->basetype) {
    case LY_TYPE_INT8:
        if (val1->int8 < val2->int8) {
            return -1;
        } else if (val1->int8 > val2->int8) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT16:
        if (val1->int16 < val2->int16) {
            return -1;
        } else if (val1->int16 > val2->int16) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT32:
        if (val1->int32 < val2->int32) {
            return -1;
        } else if (val1->int32 > val2->int32) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT64:
        if (val1->int64 < val2->int64) {
            return -1;
        } else if (val1->int64 > val2->int64) {
            return 1;
        } else {
            return 0;
        }
        break;
    default:
        break;
    }
    return 0;
}